

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefValue.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
BeliefValue::GetValues
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,BeliefSet *Beliefs,
          QFunctionsDiscrete *Q)

{
  pointer pdVar1;
  uint uVar2;
  ulong uVar3;
  pointer V;
  vector<double,_std::allocator<double>_> values;
  allocator_type local_61;
  _Vector_base<double,_std::allocator<double>_> local_60;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_60,
             (long)(Beliefs->
                   super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(Beliefs->
                   super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_48);
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0xffefffffffffffff;
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,
             (long)(Beliefs->
                   super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(Beliefs->
                   super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 3,(value_type_conflict3 *)&local_48
             ,&local_61);
  for (V = (Q->
           super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      V != (Q->
           super__Vector_base<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish; V = V + 1) {
    GetValues((vector<double,_std::allocator<double>_> *)&local_48,Beliefs,V);
    std::vector<double,_std::allocator<double>_>::_M_move_assign
              ((vector<double,_std::allocator<double>_> *)&local_60);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    pdVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar2 = 0; uVar3 = (ulong)uVar2,
        (long)local_60._M_impl.super__Vector_impl_data._M_finish -
        (long)local_60._M_impl.super__Vector_impl_data._M_start >> 3 != uVar3; uVar2 = uVar2 + 1) {
      if (pdVar1[uVar3] < local_60._M_impl.super__Vector_impl_data._M_start[uVar3]) {
        pdVar1[uVar3] = local_60._M_impl.super__Vector_impl_data._M_start[uVar3];
      }
    }
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_60);
  return __return_storage_ptr__;
}

Assistant:

vector<double> BeliefValue::GetValues(const BeliefSet &Beliefs,
                                      const QFunctionsDiscrete &Q)
{
    vector<double> values(Beliefs.size()),
        maxValues(Beliefs.size(),-DBL_MAX);
    for(QFDcit i=Q.begin();i!=Q.end();++i)
    {
        values=GetValues(Beliefs,*i);
        for(unsigned int j=0;j!=values.size();++j)
            if(values[j]>maxValues[j])
                maxValues[j]=values[j];
    }

    return(maxValues);
}